

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall inject::not_providing::~not_providing(not_providing *this)

{
  ~not_providing(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual ~not_providing() throw() { }